

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  stbi__zhuffman *z_00;
  uint uVar1;
  stbi_uc *psVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  byte *pbVar12;
  stbi_uc *psVar13;
  uint uVar14;
  stbi_uc sVar15;
  ulong uVar16;
  ulong uVar17;
  stbi__uint32 sVar18;
  stbi__uint32 sVar19;
  uint num;
  char *pcVar20;
  int iVar21;
  ulong uVar22;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  undefined8 local_a08;
  undefined7 uStack_a00;
  undefined4 uStack_9f9;
  byte bStack_9e9;
  stbi_uc local_9e8 [468];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_00105177:
    a->num_bits = 0;
    a->code_buffer = 0;
    z = &a->z_length;
    z_00 = &a->z_distance;
    iVar11 = 0;
    do {
      if (iVar11 < 1) {
        stbi__fill_bits(a);
        iVar11 = a->num_bits;
      }
      uVar1 = a->code_buffer;
      sVar18 = uVar1 >> 1;
      a->code_buffer = sVar18;
      iVar6 = iVar11 + -1;
      a->num_bits = iVar6;
      if (iVar11 < 3) {
        stbi__fill_bits(a);
        iVar6 = a->num_bits;
        sVar18 = a->code_buffer;
      }
      sVar19 = sVar18 >> 2;
      a->code_buffer = sVar19;
      uVar5 = iVar6 - 2;
      a->num_bits = uVar5;
      switch(sVar18 & 3) {
      case 0:
        if ((uVar5 & 7) != 0) {
          stbi__zreceive(a,uVar5 & 7);
          uVar5 = a->num_bits;
        }
        if ((int)uVar5 < 1) {
          if (uVar5 != 0) goto LAB_0010574d;
          uVar22 = 0;
LAB_0010563f:
          psVar13 = a->zbuffer;
          psVar2 = a->zbuffer_end;
          do {
            if (psVar13 < psVar2) {
              a->zbuffer = psVar13 + 1;
              sVar15 = *psVar13;
              psVar13 = psVar13 + 1;
            }
            else {
              sVar15 = '\0';
            }
            *(stbi_uc *)((long)local_814.fast + uVar22) = sVar15;
            uVar22 = uVar22 + 1;
          } while (uVar22 != 4);
        }
        else {
          uVar14 = uVar5 - 1 >> 3;
          uVar22 = (ulong)(uVar14 + 1);
          uVar17 = 0xffffffffffffffff;
          uVar3 = (ulong)a->code_buffer;
          do {
            uVar16 = uVar3;
            *(char *)((long)local_814.fast + uVar17 + 1) = (char)uVar16;
            uVar17 = uVar17 + 1;
            uVar3 = uVar16 >> 8;
          } while (uVar14 != uVar17);
          a->code_buffer = (stbi__uint32)(uVar16 >> 8);
          iVar11 = (uVar5 - 8) - (uVar5 - 1 & 0xfffffff8);
          a->num_bits = iVar11;
          if (iVar11 != 0) {
LAB_0010574d:
            __assert_fail("a->num_bits == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/mobius3[P]chizu/src/stb_image.h"
                          ,0xfc1,"int stbi__parse_uncompressed_block(stbi__zbuf *)");
          }
          if (uVar17 < 3) goto LAB_0010563f;
        }
        if ((local_814.fast[1] ^ local_814.fast[0]) != 0xffff) {
          stbi__g_failure_reason = "zlib corrupt";
          return 0;
        }
        psVar13 = a->zbuffer;
        uVar22 = (ulong)local_814.fast[0];
        if (a->zbuffer_end < psVar13 + uVar22) {
          stbi__g_failure_reason = "read past buffer";
          return 0;
        }
        pcVar20 = a->zout;
        if (a->zout_end < pcVar20 + uVar22) {
          iVar11 = stbi__zexpand(a,pcVar20,(uint)local_814.fast[0]);
          if (iVar11 == 0) {
            return 0;
          }
          psVar13 = a->zbuffer;
          pcVar20 = a->zout;
        }
        memcpy(pcVar20,psVar13,uVar22);
        a->zbuffer = a->zbuffer + uVar22;
        a->zout = a->zout + uVar22;
        goto LAB_001056e1;
      case 1:
        iVar11 = stbi__zbuild_huffman
                           (z,
                            "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                            ,0x120);
        if (iVar11 == 0) {
          return 0;
        }
        iVar11 = stbi__zbuild_huffman
                           (z_00,
                            "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                            ,0x20);
        break;
      case 2:
        if (iVar6 < 7) {
          stbi__fill_bits(a);
          uVar5 = a->num_bits;
          sVar19 = a->code_buffer;
        }
        uVar14 = sVar19 >> 5;
        a->code_buffer = uVar14;
        iVar11 = uVar5 - 5;
        a->num_bits = iVar11;
        if ((int)uVar5 < 10) {
          stbi__fill_bits(a);
          iVar11 = a->num_bits;
          uVar14 = a->code_buffer;
        }
        uVar5 = uVar14 >> 5;
        a->code_buffer = uVar5;
        iVar6 = iVar11 + -5;
        a->num_bits = iVar6;
        if (iVar11 < 9) {
          stbi__fill_bits(a);
          iVar6 = a->num_bits;
          uVar5 = a->code_buffer;
        }
        num = (sVar19 & 0x1f) + 0x101;
        iVar11 = (uVar14 & 0x1f) + 1;
        uVar14 = uVar5 >> 4;
        a->code_buffer = uVar14;
        iVar6 = iVar6 + -4;
        a->num_bits = iVar6;
        local_a08 = 0;
        uStack_a00 = 0;
        uStack_9f9 = 0;
        uVar22 = 0;
        do {
          uVar9 = uVar14;
          if (iVar6 < 3) {
            stbi__fill_bits(a);
            iVar6 = a->num_bits;
            uVar9 = a->code_buffer;
          }
          uVar14 = uVar9 >> 3;
          a->code_buffer = uVar14;
          iVar6 = iVar6 + -3;
          a->num_bits = iVar6;
          *(byte *)((long)&local_a08 +
                   (ulong)(byte)(&stbi__compute_huffman_codes_length_dezigzag)[uVar22]) =
               (byte)uVar9 & 7;
          uVar22 = uVar22 + 1;
        } while ((uVar5 & 0xf) + 4 != uVar22);
        iVar6 = stbi__zbuild_huffman(&local_814,(stbi_uc *)&local_a08,0x13);
        if (iVar6 == 0) {
          return 0;
        }
        iVar21 = num + iVar11;
        iVar6 = 0;
        do {
          uVar5 = stbi__zhuffman_decode(a,&local_814);
          if (0x12 < uVar5) goto LAB_001056f0;
          if (uVar5 < 0x10) {
            local_9e8[iVar6] = (char)uVar5;
            iVar6 = iVar6 + 1;
          }
          else {
            iVar10 = a->num_bits;
            if (uVar5 == 0x11) {
              if (iVar10 < 3) {
                stbi__fill_bits(a);
                iVar10 = a->num_bits;
              }
              uVar5 = a->code_buffer;
              a->code_buffer = uVar5 >> 3;
              a->num_bits = iVar10 + -3;
              uVar5 = (uVar5 & 7) + 3;
LAB_00105465:
              uVar14 = 0;
            }
            else {
              if (uVar5 != 0x10) {
                if (iVar10 < 7) {
                  stbi__fill_bits(a);
                  iVar10 = a->num_bits;
                }
                uVar5 = a->code_buffer;
                a->code_buffer = uVar5 >> 7;
                a->num_bits = iVar10 + -7;
                uVar5 = (uVar5 & 0x7f) + 0xb;
                goto LAB_00105465;
              }
              if (iVar10 < 2) {
                stbi__fill_bits(a);
                iVar10 = a->num_bits;
              }
              uVar5 = a->code_buffer;
              a->code_buffer = uVar5 >> 2;
              a->num_bits = iVar10 + -2;
              if (iVar6 == 0) goto LAB_001056f0;
              uVar5 = (uVar5 & 3) + 3;
              uVar14 = (uint)(&bStack_9e9)[iVar6];
            }
            if (iVar21 - iVar6 < (int)uVar5) goto LAB_001056f0;
            memset(local_9e8 + iVar6,uVar14,(ulong)uVar5);
            iVar6 = iVar6 + uVar5;
          }
        } while (iVar6 < iVar21);
        if (iVar6 != iVar21) {
LAB_001056f0:
          stbi__g_failure_reason = "bad codelengths";
          return 0;
        }
        iVar6 = stbi__zbuild_huffman(z,local_9e8,num);
        if (iVar6 == 0) {
          return 0;
        }
        iVar11 = stbi__zbuild_huffman(z_00,local_9e8 + num,iVar11);
        break;
      case 3:
        goto switchD_001051fb_caseD_3;
      }
      if (iVar11 == 0) {
        return 0;
      }
      pcVar20 = a->zout;
      while( true ) {
        while (iVar11 = stbi__zhuffman_decode(a,z), iVar11 < 0x100) {
          if (iVar11 < 0) goto LAB_001056f9;
          if (a->zout_end <= pcVar20) {
            iVar6 = stbi__zexpand(a,pcVar20,1);
            if (iVar6 == 0) {
              return 0;
            }
            pcVar20 = a->zout;
          }
          *pcVar20 = (char)iVar11;
          pcVar20 = pcVar20 + 1;
        }
        if (iVar11 == 0x100) break;
        uVar22 = (ulong)(iVar11 - 0x101);
        uVar5 = stbi__zlength_base[uVar22];
        if (0xffffffffffffffeb < uVar22 - 0x1c) {
          uVar14 = stbi__zreceive(a,stbi__zlength_extra[uVar22]);
          uVar5 = uVar5 + uVar14;
        }
        uVar14 = stbi__zhuffman_decode(a,z_00);
        if ((int)uVar14 < 0) {
LAB_001056f9:
          stbi__g_failure_reason = "bad huffman code";
          return 0;
        }
        uVar22 = (ulong)uVar14;
        iVar11 = stbi__zdist_base[uVar22];
        if (0xffffffffffffffe5 < uVar22 - 0x1e) {
          uVar14 = stbi__zreceive(a,stbi__zdist_extra[uVar22]);
          iVar11 = iVar11 + uVar14;
        }
        if ((long)pcVar20 - (long)a->zout_start < (long)iVar11) {
          stbi__g_failure_reason = "bad dist";
          return 0;
        }
        if (a->zout_end < pcVar20 + (int)uVar5) {
          iVar6 = stbi__zexpand(a,pcVar20,uVar5);
          if (iVar6 == 0) {
            return 0;
          }
          pcVar20 = a->zout;
        }
        lVar7 = -(long)iVar11;
        if (iVar11 == 1) {
          if (uVar5 != 0) {
            memset(pcVar20,(uint)(byte)pcVar20[lVar7],(ulong)uVar5);
            pcVar20 = pcVar20 + (ulong)(uVar5 - 1) + 1;
          }
        }
        else {
          for (; uVar5 != 0; uVar5 = uVar5 - 1) {
            *pcVar20 = pcVar20[lVar7];
            pcVar20 = pcVar20 + 1;
          }
        }
      }
      a->zout = pcVar20;
LAB_001056e1:
      if ((uVar1 & 1) != 0) {
        return 1;
      }
      iVar11 = a->num_bits;
    } while( true );
  }
  pbVar12 = a->zbuffer;
  uVar8 = 0;
  if (pbVar12 < a->zbuffer_end) {
    a->zbuffer = pbVar12 + 1;
    bVar4 = *pbVar12;
    pbVar12 = pbVar12 + 1;
  }
  else {
    bVar4 = 0;
  }
  if (pbVar12 < a->zbuffer_end) {
    a->zbuffer = pbVar12 + 1;
    uVar8 = (ushort)*pbVar12;
  }
  if ((ushort)(((ushort)bVar4 << 8 | uVar8) * 0x7bdf) < 0x843) {
    if ((uVar8 & 0x20) == 0) {
      if ((bVar4 & 0xf) == 8) goto LAB_00105177;
      stbi__g_failure_reason = "bad compression";
    }
    else {
      stbi__g_failure_reason = "no preset dict";
    }
  }
  else {
    stbi__g_failure_reason = "bad zlib header";
  }
switchD_001051fb_caseD_3:
  return 0;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}